

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

int linklist_5_3::create_tail(LinkList *list,int *a,int n)

{
  sqlist_5_3 *this;
  LinkList list_00;
  ulong uVar1;
  sqlist_5_3 *psVar2;
  
  list_00 = (LinkList)a;
  this = (sqlist_5_3 *)malloc(0x10);
  *(undefined8 *)(this + 8) = 0;
  if (0 < n) {
    uVar1 = 0;
    psVar2 = this;
    do {
      this = (sqlist_5_3 *)malloc(0x10);
      *(int *)this = a[uVar1];
      *(sqlist_5_3 **)(psVar2 + 8) = this;
      uVar1 = uVar1 + 1;
      psVar2 = this;
    } while ((uint)n != uVar1);
  }
  sqlist_5_3::test_1(this,list_00);
}

Assistant:

int create_tail(LinkList &list, int *a, int n = 10) {
        LinkList q = newNode, p;
        q->next = nullptr;
        for (int i = 0; i < n; i++) {
            p = newNode;
            p->data = a[i];
            q->next = p;
            q = p;
        }
        ps_link_list(q);
    }